

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  vfloat<4> vVar3;
  uint uVar4;
  float *pfVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  vbool<4> vVar25;
  uint uVar26;
  int iVar27;
  float *vertices;
  undefined4 uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  NodeRef root;
  size_t sVar32;
  size_t sVar33;
  uint uVar34;
  ulong uVar35;
  NodeRef *pNVar36;
  ulong uVar37;
  ulong uVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar114;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_ZMM15 [64];
  undefined1 auVar131 [64];
  Precalculations pre;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  vbool<4> terminated;
  undefined1 local_1a28 [16];
  BVH *local_1a18;
  Intersectors *local_1a10;
  Scene *local_1a08;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [8];
  float fStack_1870;
  float fStack_186c;
  undefined1 local_1868 [8];
  float fStack_1860;
  float fStack_185c;
  longlong local_1788;
  longlong lStack_1780;
  longlong local_1778;
  longlong lStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1a18 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1a18->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar53 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar61 = vpcmpeqd_avx(auVar53,(undefined1  [16])valid_i->field_0);
    auVar54 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar54,5);
    auVar62 = auVar61 & auVar11;
    if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar62[0xf] < '\0')
    {
      auVar11 = vandps_avx(auVar11,auVar61);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar115._8_4_ = 0x7fffffff;
      auVar115._0_8_ = 0x7fffffff7fffffff;
      auVar115._12_4_ = 0x7fffffff;
      auVar61 = vandps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar109._8_4_ = 0x219392ef;
      auVar109._0_8_ = 0x219392ef219392ef;
      auVar109._12_4_ = 0x219392ef;
      auVar62 = vcmpps_avx(auVar61,auVar109,1);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar120,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar61 = vandps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar88 = vcmpps_avx(auVar61,auVar109,1);
      auVar96 = vdivps_avx(auVar120,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar61 = vandps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar61 = vcmpps_avx(auVar61,auVar109,1);
      auVar97 = vdivps_avx(auVar120,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar110._8_4_ = 0x5d5e0b6b;
      auVar110._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar110._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar95,auVar110,auVar62);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar96,auVar110,auVar88);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar97,auVar110,auVar61);
      auVar61 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar54,1);
      auVar95._8_4_ = 0x10;
      auVar95._0_8_ = 0x1000000010;
      auVar95._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar61,auVar95);
      auVar61 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar54,5);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar96._8_4_ = 0x30;
      auVar96._0_8_ = 0x3000000030;
      auVar96._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar96,auVar62,auVar61);
      auVar61 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar54,5);
      auVar88._8_4_ = 0x40;
      auVar88._0_8_ = 0x4000000040;
      auVar88._12_4_ = 0x40;
      auVar97._8_4_ = 0x50;
      auVar97._0_8_ = 0x5000000050;
      auVar97._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar97,auVar88,auVar61);
      auVar61 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar54);
      auVar62 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar54);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar121 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar61,auVar11);
      auVar61._8_4_ = 0xff800000;
      auVar61._0_8_ = 0xff800000ff800000;
      auVar61._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar61,auVar62,auVar11);
      terminated.field_0.i[1] = auVar11._4_4_ ^ auVar53._4_4_;
      terminated.field_0.i[0] = auVar11._0_4_ ^ auVar53._0_4_;
      terminated.field_0.i[2] = auVar11._8_4_ ^ auVar53._8_4_;
      terminated.field_0.i[3] = auVar11._12_4_ ^ auVar53._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar39 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar122 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar125 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar53 = vpcmpeqd_avx(in_ZMM15._0_16_,in_ZMM15._0_16_);
      auVar131 = ZEXT1664(auVar53);
      local_1a10 = This;
LAB_019c100c:
      do {
        do {
          root.ptr = pNVar36[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019c1b7f;
          pNVar36 = pNVar36 + -1;
          paVar39 = paVar39 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar39->v;
          auVar65 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar53 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar26 = vmovmskps_avx(auVar53);
        } while (uVar26 == 0);
        uVar38 = (ulong)(uVar26 & 0xff);
        uVar26 = POPCOUNT(uVar26 & 0xff);
        if (uVar34 < uVar26) {
LAB_019c104c:
          do {
            vVar25.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019c1b7f;
              auVar53 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar65._0_16_,6);
              if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar53[0xf]) goto LAB_019c100c;
              uVar38 = (ulong)((uint)root.ptr & 0xf);
              if (uVar38 == 8) goto LAB_019c1a71;
              auVar54._0_4_ = auVar131._0_4_ ^ terminated.field_0._0_4_;
              auVar54._4_4_ = auVar131._4_4_ ^ terminated.field_0._4_4_;
              auVar54._8_4_ = auVar131._8_4_ ^ terminated.field_0._8_4_;
              auVar54._12_4_ = auVar131._12_4_ ^ terminated.field_0._12_4_;
              lVar30 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              uVar35 = 0;
              goto LAB_019c123c;
            }
            lVar30 = 0;
            sVar33 = 8;
            auVar53 = auVar121._0_16_;
            do {
              sVar32 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar30 * 8);
              if (sVar32 == 8) {
                auVar65 = ZEXT1664(auVar53);
                sVar32 = sVar33;
                break;
              }
              uVar28 = *(undefined4 *)(root.ptr + 0x20 + lVar30 * 4);
              auVar46._4_4_ = uVar28;
              auVar46._0_4_ = uVar28;
              auVar46._8_4_ = uVar28;
              auVar46._12_4_ = uVar28;
              auVar20._8_8_ = tray.org.field_0._8_8_;
              auVar20._0_8_ = tray.org.field_0._0_8_;
              auVar21._8_8_ = tray.org.field_0._24_8_;
              auVar21._0_8_ = tray.org.field_0._16_8_;
              auVar22._8_8_ = tray.org.field_0._40_8_;
              auVar22._0_8_ = tray.org.field_0._32_8_;
              auVar61 = vsubps_avx(auVar46,auVar20);
              auVar98._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar61._0_4_;
              auVar98._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar61._4_4_;
              auVar98._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar61._8_4_;
              auVar98._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar61._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar30 * 4);
              auVar47._4_4_ = uVar28;
              auVar47._0_4_ = uVar28;
              auVar47._8_4_ = uVar28;
              auVar47._12_4_ = uVar28;
              auVar61 = vsubps_avx(auVar47,auVar21);
              auVar105._0_4_ = tray.rdir.field_0._16_4_ * auVar61._0_4_;
              auVar105._4_4_ = tray.rdir.field_0._20_4_ * auVar61._4_4_;
              auVar105._8_4_ = tray.rdir.field_0._24_4_ * auVar61._8_4_;
              auVar105._12_4_ = tray.rdir.field_0._28_4_ * auVar61._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar30 * 4);
              auVar48._4_4_ = uVar28;
              auVar48._0_4_ = uVar28;
              auVar48._8_4_ = uVar28;
              auVar48._12_4_ = uVar28;
              auVar61 = vsubps_avx(auVar48,auVar22);
              auVar112._0_4_ = tray.rdir.field_0._32_4_ * auVar61._0_4_;
              auVar112._4_4_ = tray.rdir.field_0._36_4_ * auVar61._4_4_;
              auVar112._8_4_ = tray.rdir.field_0._40_4_ * auVar61._8_4_;
              auVar112._12_4_ = tray.rdir.field_0._44_4_ * auVar61._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x30 + lVar30 * 4);
              auVar49._4_4_ = uVar28;
              auVar49._0_4_ = uVar28;
              auVar49._8_4_ = uVar28;
              auVar49._12_4_ = uVar28;
              auVar61 = vsubps_avx(auVar49,auVar20);
              auVar66._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar61._0_4_;
              auVar66._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar61._4_4_;
              auVar66._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar61._8_4_;
              auVar66._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar61._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x50 + lVar30 * 4);
              auVar50._4_4_ = uVar28;
              auVar50._0_4_ = uVar28;
              auVar50._8_4_ = uVar28;
              auVar50._12_4_ = uVar28;
              auVar61 = vsubps_avx(auVar50,auVar21);
              auVar77._0_4_ = tray.rdir.field_0._16_4_ * auVar61._0_4_;
              auVar77._4_4_ = tray.rdir.field_0._20_4_ * auVar61._4_4_;
              auVar77._8_4_ = tray.rdir.field_0._24_4_ * auVar61._8_4_;
              auVar77._12_4_ = tray.rdir.field_0._28_4_ * auVar61._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x70 + lVar30 * 4);
              auVar51._4_4_ = uVar28;
              auVar51._0_4_ = uVar28;
              auVar51._8_4_ = uVar28;
              auVar51._12_4_ = uVar28;
              auVar61 = vsubps_avx(auVar51,auVar22);
              auVar82._0_4_ = tray.rdir.field_0._32_4_ * auVar61._0_4_;
              auVar82._4_4_ = tray.rdir.field_0._36_4_ * auVar61._4_4_;
              auVar82._8_4_ = tray.rdir.field_0._40_4_ * auVar61._8_4_;
              auVar82._12_4_ = tray.rdir.field_0._44_4_ * auVar61._12_4_;
              auVar61 = vminps_avx(auVar98,auVar66);
              auVar62 = vminps_avx(auVar105,auVar77);
              auVar61 = vmaxps_avx(auVar61,auVar62);
              auVar62 = vminps_avx(auVar112,auVar82);
              auVar61 = vmaxps_avx(auVar61,auVar62);
              auVar52._0_4_ = auVar122._0_4_ * auVar61._0_4_;
              auVar52._4_4_ = auVar122._4_4_ * auVar61._4_4_;
              auVar52._8_4_ = auVar122._8_4_ * auVar61._8_4_;
              auVar52._12_4_ = auVar122._12_4_ * auVar61._12_4_;
              auVar61 = vmaxps_avx(auVar98,auVar66);
              auVar62 = vmaxps_avx(auVar105,auVar77);
              auVar62 = vminps_avx(auVar61,auVar62);
              auVar61 = vmaxps_avx(auVar112,auVar82);
              auVar61 = vminps_avx(auVar62,auVar61);
              auVar67._0_4_ = auVar125._0_4_ * auVar61._0_4_;
              auVar67._4_4_ = auVar125._4_4_ * auVar61._4_4_;
              auVar67._8_4_ = auVar125._8_4_ * auVar61._8_4_;
              auVar67._12_4_ = auVar125._12_4_ * auVar61._12_4_;
              auVar61 = vmaxps_avx(auVar52,(undefined1  [16])tray.tnear.field_0);
              auVar62 = vminps_avx(auVar67,(undefined1  [16])tray.tfar.field_0);
              auVar61 = vcmpps_avx(auVar61,auVar62,2);
              if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar61[0xf]) {
                auVar65 = ZEXT1664(auVar53);
                sVar32 = sVar33;
              }
              else {
                auVar61 = vblendvps_avx(auVar121._0_16_,auVar52,auVar61);
                auVar65 = ZEXT1664(auVar61);
                if (sVar33 != 8) {
                  pNVar36->ptr = sVar33;
                  pNVar36 = pNVar36 + 1;
                  *(undefined1 (*) [16])paVar39->v = auVar53;
                  paVar39 = paVar39 + 1;
                }
              }
              lVar30 = lVar30 + 1;
              auVar53 = auVar65._0_16_;
              sVar33 = sVar32;
            } while (lVar30 != 4);
            iVar27 = 4;
            if (sVar32 == 8) goto LAB_019c11d5;
            auVar53 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar65._0_16_,6);
            uVar28 = vmovmskps_avx(auVar53);
            root.ptr = sVar32;
          } while ((byte)uVar34 < (byte)POPCOUNT(uVar28));
          pNVar36->ptr = sVar32;
          pNVar36 = pNVar36 + 1;
          *paVar39 = auVar65._0_16_;
          paVar39 = paVar39 + 1;
        }
        else {
          do {
            sVar33 = 0;
            for (uVar35 = uVar38; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              sVar33 = sVar33 + 1;
            }
            auVar131 = ZEXT1664(auVar131._0_16_);
            bVar40 = occluded1(local_1a10,local_1a18,root,sVar33,&pre,ray,&tray,context);
            if (bVar40) {
              terminated.field_0.i[sVar33] = -1;
            }
            uVar38 = uVar38 - 1 & uVar38;
          } while (uVar38 != 0);
          auVar53 = vpcmpeqd_avx(auVar131._0_16_,auVar131._0_16_);
          auVar131 = ZEXT1664(auVar53);
          auVar53 = auVar53 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar53[0xf]) {
            iVar27 = 3;
          }
          else {
            auVar53._8_4_ = 0xff800000;
            auVar53._0_8_ = 0xff800000ff800000;
            auVar53._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar53,
                               (undefined1  [16])terminated.field_0);
            iVar27 = 2;
          }
          auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar122 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar125 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar65 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar34 < uVar26) goto LAB_019c104c;
        }
LAB_019c11d5:
      } while ((iVar27 == 4) || (iVar27 == 2));
LAB_019c1b7f:
      auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
      auVar64._8_4_ = 0xff800000;
      auVar64._0_8_ = 0xff800000ff800000;
      auVar64._12_4_ = 0xff800000;
      auVar11 = vmaskmovps_avx(auVar11,auVar64);
      *(undefined1 (*) [16])pRVar1 = auVar11;
    }
  }
  return;
  while( true ) {
    uVar35 = uVar35 + 1;
    lVar30 = lVar30 + 0x50;
    auVar54 = auVar61;
    if (uVar38 - 8 <= uVar35) break;
LAB_019c123c:
    v = (vuint<4> *)(uVar35 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_1a08 = context->scene;
    uVar37 = 0;
    auVar53 = auVar54;
    while (*(int *)(lVar30 + uVar37 * 4) != -1) {
      pfVar5 = (local_1a08->vertices).items[*(uint *)(lVar30 + -0x10 + uVar37 * 4)];
      uVar29 = (ulong)*(uint *)(lVar30 + -0x40 + uVar37 * 4);
      uVar31 = (ulong)*(uint *)(lVar30 + -0x30 + uVar37 * 4);
      fVar2 = pfVar5[uVar29];
      auVar41._4_4_ = fVar2;
      auVar41._0_4_ = fVar2;
      auVar41._8_4_ = fVar2;
      auVar41._12_4_ = fVar2;
      fVar2 = pfVar5[uVar29 + 1];
      auVar55._4_4_ = fVar2;
      auVar55._0_4_ = fVar2;
      auVar55._8_4_ = fVar2;
      auVar55._12_4_ = fVar2;
      fVar2 = pfVar5[uVar29 + 2];
      auVar68._4_4_ = fVar2;
      auVar68._0_4_ = fVar2;
      auVar68._8_4_ = fVar2;
      auVar68._12_4_ = fVar2;
      fVar2 = pfVar5[uVar31];
      auVar78._4_4_ = fVar2;
      auVar78._0_4_ = fVar2;
      auVar78._8_4_ = fVar2;
      auVar78._12_4_ = fVar2;
      fVar2 = pfVar5[uVar31 + 1];
      auVar83._4_4_ = fVar2;
      auVar83._0_4_ = fVar2;
      auVar83._8_4_ = fVar2;
      auVar83._12_4_ = fVar2;
      fVar2 = pfVar5[uVar31 + 2];
      auVar89._4_4_ = fVar2;
      auVar89._0_4_ = fVar2;
      auVar89._8_4_ = fVar2;
      auVar89._12_4_ = fVar2;
      uVar29 = (ulong)*(uint *)(lVar30 + -0x20 + uVar37 * 4);
      fVar2 = pfVar5[uVar29];
      auVar99._4_4_ = fVar2;
      auVar99._0_4_ = fVar2;
      auVar99._8_4_ = fVar2;
      auVar99._12_4_ = fVar2;
      fVar2 = pfVar5[uVar29 + 1];
      auVar124._4_4_ = fVar2;
      auVar124._0_4_ = fVar2;
      auVar124._8_4_ = fVar2;
      auVar124._12_4_ = fVar2;
      fVar2 = pfVar5[uVar29 + 2];
      auVar106._4_4_ = fVar2;
      auVar106._0_4_ = fVar2;
      auVar106._8_4_ = fVar2;
      auVar106._12_4_ = fVar2;
      local_1778 = v[3].field_0.v[0];
      lStack_1770 = v[3].field_0.v[1];
      local_1788 = v[4].field_0.v[0];
      lStack_1780 = v[4].field_0.v[1];
      auVar61 = *(undefined1 (*) [16])ray;
      auVar62 = *(undefined1 (*) [16])(ray + 0x10);
      auVar88 = *(undefined1 (*) [16])(ray + 0x20);
      auVar96 = vsubps_avx(auVar41,auVar61);
      auVar97 = vsubps_avx(auVar55,auVar62);
      auVar95 = vsubps_avx(auVar68,auVar88);
      auVar109 = vsubps_avx(auVar78,auVar61);
      auVar110 = vsubps_avx(auVar83,auVar62);
      auVar120 = vsubps_avx(auVar89,auVar88);
      auVar41 = vsubps_avx(auVar99,auVar61);
      auVar43 = vsubps_avx(auVar124,auVar62);
      auVar88 = vsubps_avx(auVar106,auVar88);
      auVar55 = vsubps_avx(auVar41,auVar96);
      auVar68 = vsubps_avx(auVar43,auVar97);
      auVar78 = vsubps_avx(auVar88,auVar95);
      auVar79._0_4_ = auVar41._0_4_ + auVar96._0_4_;
      auVar79._4_4_ = auVar41._4_4_ + auVar96._4_4_;
      auVar79._8_4_ = auVar41._8_4_ + auVar96._8_4_;
      auVar79._12_4_ = auVar41._12_4_ + auVar96._12_4_;
      auVar100._0_4_ = auVar97._0_4_ + auVar43._0_4_;
      auVar100._4_4_ = auVar97._4_4_ + auVar43._4_4_;
      auVar100._8_4_ = auVar97._8_4_ + auVar43._8_4_;
      auVar100._12_4_ = auVar97._12_4_ + auVar43._12_4_;
      fVar2 = auVar95._0_4_;
      auVar107._0_4_ = auVar88._0_4_ + fVar2;
      fVar8 = auVar95._4_4_;
      auVar107._4_4_ = auVar88._4_4_ + fVar8;
      fVar9 = auVar95._8_4_;
      auVar107._8_4_ = auVar88._8_4_ + fVar9;
      fVar10 = auVar95._12_4_;
      auVar107._12_4_ = auVar88._12_4_ + fVar10;
      auVar116._0_4_ = auVar78._0_4_ * auVar100._0_4_;
      auVar116._4_4_ = auVar78._4_4_ * auVar100._4_4_;
      auVar116._8_4_ = auVar78._8_4_ * auVar100._8_4_;
      auVar116._12_4_ = auVar78._12_4_ * auVar100._12_4_;
      auVar83 = vfmsub231ps_fma(auVar116,auVar68,auVar107);
      auVar113._0_4_ = auVar107._0_4_ * auVar55._0_4_;
      auVar113._4_4_ = auVar107._4_4_ * auVar55._4_4_;
      auVar113._8_4_ = auVar107._8_4_ * auVar55._8_4_;
      auVar113._12_4_ = auVar107._12_4_ * auVar55._12_4_;
      auVar62 = vfmsub231ps_fma(auVar113,auVar78,auVar79);
      auVar80._0_4_ = auVar68._0_4_ * auVar79._0_4_;
      auVar80._4_4_ = auVar68._4_4_ * auVar79._4_4_;
      auVar80._8_4_ = auVar68._8_4_ * auVar79._8_4_;
      auVar80._12_4_ = auVar68._12_4_ * auVar79._12_4_;
      auVar61 = vfmsub231ps_fma(auVar80,auVar55,auVar100);
      fVar16 = *(float *)(ray + 0x60);
      fVar17 = *(float *)(ray + 100);
      fVar18 = *(float *)(ray + 0x68);
      auVar24 = *(undefined1 (*) [12])(ray + 0x60);
      fVar19 = *(float *)(ray + 0x6c);
      auVar81._0_4_ = fVar16 * auVar61._0_4_;
      auVar81._4_4_ = fVar17 * auVar61._4_4_;
      auVar81._8_4_ = fVar18 * auVar61._8_4_;
      auVar81._12_4_ = fVar19 * auVar61._12_4_;
      auVar61 = *(undefined1 (*) [16])(ray + 0x50);
      auVar79 = vfmadd231ps_fma(auVar81,auVar61,auVar62);
      auVar62 = *(undefined1 (*) [16])(ray + 0x40);
      auVar89 = vfmadd231ps_fma(auVar79,auVar62,auVar83);
      auVar79 = vsubps_avx(auVar97,auVar110);
      auVar83 = vsubps_avx(auVar95,auVar120);
      auVar101._0_4_ = auVar97._0_4_ + auVar110._0_4_;
      auVar101._4_4_ = auVar97._4_4_ + auVar110._4_4_;
      auVar101._8_4_ = auVar97._8_4_ + auVar110._8_4_;
      auVar101._12_4_ = auVar97._12_4_ + auVar110._12_4_;
      auVar129._0_4_ = fVar2 + auVar120._0_4_;
      auVar129._4_4_ = fVar8 + auVar120._4_4_;
      auVar129._8_4_ = fVar9 + auVar120._8_4_;
      auVar129._12_4_ = fVar10 + auVar120._12_4_;
      fVar123 = auVar83._0_4_;
      auVar90._0_4_ = fVar123 * auVar101._0_4_;
      fVar126 = auVar83._4_4_;
      auVar90._4_4_ = fVar126 * auVar101._4_4_;
      fVar127 = auVar83._8_4_;
      auVar90._8_4_ = fVar127 * auVar101._8_4_;
      fVar128 = auVar83._12_4_;
      auVar90._12_4_ = fVar128 * auVar101._12_4_;
      auVar81 = vfmsub231ps_fma(auVar90,auVar79,auVar129);
      auVar80 = vsubps_avx(auVar96,auVar109);
      fVar12 = auVar80._0_4_;
      auVar130._0_4_ = auVar129._0_4_ * fVar12;
      fVar13 = auVar80._4_4_;
      auVar130._4_4_ = auVar129._4_4_ * fVar13;
      fVar14 = auVar80._8_4_;
      auVar130._8_4_ = auVar129._8_4_ * fVar14;
      fVar15 = auVar80._12_4_;
      auVar130._12_4_ = auVar129._12_4_ * fVar15;
      auVar103._0_4_ = auVar109._0_4_ + auVar96._0_4_;
      auVar103._4_4_ = auVar109._4_4_ + auVar96._4_4_;
      auVar103._8_4_ = auVar109._8_4_ + auVar96._8_4_;
      auVar103._12_4_ = auVar109._12_4_ + auVar96._12_4_;
      auVar95 = vfmsub231ps_fma(auVar130,auVar83,auVar103);
      fVar114 = auVar79._0_4_;
      auVar104._0_4_ = fVar114 * auVar103._0_4_;
      fVar117 = auVar79._4_4_;
      auVar104._4_4_ = fVar117 * auVar103._4_4_;
      fVar118 = auVar79._8_4_;
      auVar104._8_4_ = fVar118 * auVar103._8_4_;
      fVar119 = auVar79._12_4_;
      auVar104._12_4_ = fVar119 * auVar103._12_4_;
      auVar90 = vfmsub231ps_fma(auVar104,auVar80,auVar101);
      auVar102._0_4_ = fVar16 * auVar90._0_4_;
      auVar102._4_4_ = fVar17 * auVar90._4_4_;
      auVar102._8_4_ = fVar18 * auVar90._8_4_;
      auVar102._12_4_ = fVar19 * auVar90._12_4_;
      auVar95 = vfmadd231ps_fma(auVar102,auVar61,auVar95);
      auVar90 = vfmadd231ps_fma(auVar95,auVar62,auVar81);
      auVar81 = vsubps_avx(auVar109,auVar41);
      auVar56._0_4_ = auVar109._0_4_ + auVar41._0_4_;
      auVar56._4_4_ = auVar109._4_4_ + auVar41._4_4_;
      auVar56._8_4_ = auVar109._8_4_ + auVar41._8_4_;
      auVar56._12_4_ = auVar109._12_4_ + auVar41._12_4_;
      auVar109 = vsubps_avx(auVar110,auVar43);
      auVar42._0_4_ = auVar110._0_4_ + auVar43._0_4_;
      auVar42._4_4_ = auVar110._4_4_ + auVar43._4_4_;
      auVar42._8_4_ = auVar110._8_4_ + auVar43._8_4_;
      auVar42._12_4_ = auVar110._12_4_ + auVar43._12_4_;
      auVar110 = vsubps_avx(auVar120,auVar88);
      auVar69._0_4_ = auVar120._0_4_ + auVar88._0_4_;
      auVar69._4_4_ = auVar120._4_4_ + auVar88._4_4_;
      auVar69._8_4_ = auVar120._8_4_ + auVar88._8_4_;
      auVar69._12_4_ = auVar120._12_4_ + auVar88._12_4_;
      auVar84._0_4_ = auVar110._0_4_ * auVar42._0_4_;
      auVar84._4_4_ = auVar110._4_4_ * auVar42._4_4_;
      auVar84._8_4_ = auVar110._8_4_ * auVar42._8_4_;
      auVar84._12_4_ = auVar110._12_4_ * auVar42._12_4_;
      auVar95 = vfmsub231ps_fma(auVar84,auVar109,auVar69);
      auVar70._0_4_ = auVar81._0_4_ * auVar69._0_4_;
      auVar70._4_4_ = auVar81._4_4_ * auVar69._4_4_;
      auVar70._8_4_ = auVar81._8_4_ * auVar69._8_4_;
      auVar70._12_4_ = auVar81._12_4_ * auVar69._12_4_;
      auVar88 = vfmsub231ps_fma(auVar70,auVar110,auVar56);
      auVar57._0_4_ = auVar109._0_4_ * auVar56._0_4_;
      auVar57._4_4_ = auVar109._4_4_ * auVar56._4_4_;
      auVar57._8_4_ = auVar109._8_4_ * auVar56._8_4_;
      auVar57._12_4_ = auVar109._12_4_ * auVar56._12_4_;
      auVar120 = vfmsub231ps_fma(auVar57,auVar81,auVar42);
      auVar43._0_4_ = fVar16 * auVar120._0_4_;
      auVar43._4_4_ = fVar17 * auVar120._4_4_;
      auVar43._8_4_ = fVar18 * auVar120._8_4_;
      auVar43._12_4_ = fVar19 * auVar120._12_4_;
      auVar88 = vfmadd231ps_fma(auVar43,auVar61,auVar88);
      auVar120 = vfmadd231ps_fma(auVar88,auVar62,auVar95);
      auVar91._0_4_ = auVar120._0_4_ + auVar89._0_4_ + auVar90._0_4_;
      auVar91._4_4_ = auVar120._4_4_ + auVar89._4_4_ + auVar90._4_4_;
      auVar91._8_4_ = auVar120._8_4_ + auVar89._8_4_ + auVar90._8_4_;
      auVar91._12_4_ = auVar120._12_4_ + auVar89._12_4_ + auVar90._12_4_;
      auVar88 = vandps_avx(auVar115,auVar91);
      auVar58._0_4_ = auVar88._0_4_ * 1.1920929e-07;
      auVar58._4_4_ = auVar88._4_4_ * 1.1920929e-07;
      auVar58._8_4_ = auVar88._8_4_ * 1.1920929e-07;
      auVar58._12_4_ = auVar88._12_4_ * 1.1920929e-07;
      auVar88 = vminps_avx(auVar89,auVar90);
      auVar88 = vminps_avx(auVar88,auVar120);
      uVar29 = CONCAT44(auVar58._4_4_,auVar58._0_4_);
      auVar85._0_8_ = uVar29 ^ 0x8000000080000000;
      auVar85._8_4_ = -auVar58._8_4_;
      auVar85._12_4_ = -auVar58._12_4_;
      auVar88 = vcmpps_avx(auVar88,auVar85,5);
      auVar95 = vmaxps_avx(auVar89,auVar90);
      auVar95 = vmaxps_avx(auVar95,auVar120);
      auVar95 = vcmpps_avx(auVar95,auVar58,2);
      auVar88 = vorps_avx(auVar88,auVar95);
      auVar95 = auVar53 & auVar88;
      auVar88 = vandps_avx(auVar88,auVar53);
      if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar95 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar95 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar95[0xf])
      {
        auVar61 = vpcmpeqd_avx(auVar81,auVar81);
      }
      else {
        auVar44._0_4_ = fVar114 * auVar78._0_4_;
        auVar44._4_4_ = fVar117 * auVar78._4_4_;
        auVar44._8_4_ = fVar118 * auVar78._8_4_;
        auVar44._12_4_ = fVar119 * auVar78._12_4_;
        auVar120 = vfmsub213ps_fma(auVar68,auVar83,auVar44);
        auVar71._0_4_ = auVar109._0_4_ * fVar123;
        auVar71._4_4_ = auVar109._4_4_ * fVar126;
        auVar71._8_4_ = auVar109._8_4_ * fVar127;
        auVar71._12_4_ = auVar109._12_4_ * fVar128;
        auVar86._0_4_ = fVar12 * auVar110._0_4_;
        auVar86._4_4_ = fVar13 * auVar110._4_4_;
        auVar86._8_4_ = fVar14 * auVar110._8_4_;
        auVar86._12_4_ = fVar15 * auVar110._12_4_;
        auVar41 = vfmsub213ps_fma(auVar110,auVar79,auVar71);
        auVar95 = vandps_avx(auVar115,auVar44);
        auVar110 = vandps_avx(auVar115,auVar71);
        auVar95 = vcmpps_avx(auVar95,auVar110,1);
        auVar120 = vblendvps_avx(auVar41,auVar120,auVar95);
        auVar92._0_4_ = auVar81._0_4_ * fVar114;
        auVar92._4_4_ = auVar81._4_4_ * fVar117;
        auVar92._8_4_ = auVar81._8_4_ * fVar118;
        auVar92._12_4_ = auVar81._12_4_ * fVar119;
        auVar41 = vfmsub213ps_fma(auVar81,auVar83,auVar86);
        auVar72._0_4_ = fVar123 * auVar55._0_4_;
        auVar72._4_4_ = fVar126 * auVar55._4_4_;
        auVar72._8_4_ = fVar127 * auVar55._8_4_;
        auVar72._12_4_ = fVar128 * auVar55._12_4_;
        auVar43 = vfmsub213ps_fma(auVar78,auVar80,auVar72);
        auVar95 = vandps_avx(auVar115,auVar72);
        auVar110 = vandps_avx(auVar115,auVar86);
        auVar95 = vcmpps_avx(auVar95,auVar110,1);
        auVar110 = vblendvps_avx(auVar41,auVar43,auVar95);
        auVar23._4_4_ = fVar13 * auVar68._4_4_;
        auVar23._0_4_ = fVar12 * auVar68._0_4_;
        auVar23._8_4_ = fVar14 * auVar68._8_4_;
        auVar23._12_4_ = fVar15 * auVar68._12_4_;
        auVar43 = vfmsub213ps_fma(auVar55,auVar79,auVar23);
        auVar55 = vfmsub213ps_fma(auVar109,auVar80,auVar92);
        auVar95 = vandps_avx(auVar115,auVar23);
        auVar109 = vandps_avx(auVar115,auVar92);
        auVar95 = vcmpps_avx(auVar95,auVar109,1);
        auVar95 = vblendvps_avx(auVar55,auVar43,auVar95);
        local_1a78 = auVar24._0_4_;
        fStack_1a74 = auVar24._4_4_;
        fStack_1a70 = auVar24._8_4_;
        auVar59._0_4_ = auVar95._0_4_ * local_1a78;
        auVar59._4_4_ = auVar95._4_4_ * fStack_1a74;
        auVar59._8_4_ = auVar95._8_4_ * fStack_1a70;
        auVar59._12_4_ = auVar95._12_4_ * fVar19;
        auVar61 = vfmadd213ps_fma(auVar61,auVar110,auVar59);
        auVar61 = vfmadd213ps_fma(auVar62,auVar120,auVar61);
        auVar60._0_4_ = auVar61._0_4_ + auVar61._0_4_;
        auVar60._4_4_ = auVar61._4_4_ + auVar61._4_4_;
        auVar60._8_4_ = auVar61._8_4_ + auVar61._8_4_;
        auVar60._12_4_ = auVar61._12_4_ + auVar61._12_4_;
        auVar93._0_4_ = auVar95._0_4_ * fVar2;
        auVar93._4_4_ = auVar95._4_4_ * fVar8;
        auVar93._8_4_ = auVar95._8_4_ * fVar9;
        auVar93._12_4_ = auVar95._12_4_ * fVar10;
        auVar61 = vfmadd213ps_fma(auVar97,auVar110,auVar93);
        auVar62 = vfmadd213ps_fma(auVar96,auVar120,auVar61);
        auVar61 = vrcpps_avx(auVar60);
        auVar111._8_4_ = 0x3f800000;
        auVar111._0_8_ = 0x3f8000003f800000;
        auVar111._12_4_ = 0x3f800000;
        auVar96 = vfnmadd213ps_fma(auVar61,auVar60,auVar111);
        auVar61 = vfmadd132ps_fma(auVar96,auVar61,auVar61);
        auVar94._0_4_ = auVar61._0_4_ * (auVar62._0_4_ + auVar62._0_4_);
        auVar94._4_4_ = auVar61._4_4_ * (auVar62._4_4_ + auVar62._4_4_);
        auVar94._8_4_ = auVar61._8_4_ * (auVar62._8_4_ + auVar62._8_4_);
        auVar94._12_4_ = auVar61._12_4_ * (auVar62._12_4_ + auVar62._12_4_);
        auVar61 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar94,2);
        auVar62 = vcmpps_avx(auVar94,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar61 = vandps_avx(auVar62,auVar61);
        uVar29 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
        auVar108._0_8_ = uVar29 ^ 0x8000000080000000;
        auVar108._8_4_ = -auVar60._8_4_;
        auVar108._12_4_ = -auVar60._12_4_;
        auVar62 = vcmpps_avx(auVar108,auVar60,4);
        auVar61 = vandps_avx(auVar62,auVar61);
        auVar61 = vpslld_avx(auVar61,0x1f);
        auVar62 = vpsrad_avx(auVar61,0x1f);
        auVar61 = auVar88 & auVar62;
        auVar88 = vandps_avx(auVar62,auVar88);
        if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar61[0xf] < '\0') {
          local_18c8 = auVar95;
          local_18b8 = auVar110;
          local_18a8 = auVar120;
          local_1898 = auVar94;
          local_1888 = auVar91;
          _local_1878 = auVar90;
          _local_1868 = auVar89;
        }
        auVar61 = vpcmpeqd_avx(auVar41,auVar41);
      }
      auVar131 = ZEXT1664(auVar61);
      auVar125 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar122 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      uVar4 = *(uint *)((long)&local_1778 + uVar37 * 4);
      pGVar6 = (context->scene->geometries).items[uVar4].ptr;
      uVar26 = pGVar6->mask;
      auVar45._4_4_ = uVar26;
      auVar45._0_4_ = uVar26;
      auVar45._8_4_ = uVar26;
      auVar45._12_4_ = uVar26;
      auVar62 = vpand_avx(auVar45,*(undefined1 (*) [16])(ray + 0x90));
      auVar62 = vpcmpeqd_avx(auVar62,_DAT_01f7aa10);
      auVar95 = auVar88 & ~auVar62;
      if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar95[0xf] < '\0'
         ) {
        uVar28 = *(undefined4 *)((long)&local_1788 + uVar37 * 4);
        auVar62 = vandnps_avx(auVar62,auVar88);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar88 = vandps_avx(auVar115,local_1888);
          auVar95 = vrcpps_avx(local_1888);
          auVar87._8_4_ = 0x3f800000;
          auVar87._0_8_ = 0x3f8000003f800000;
          auVar87._12_4_ = 0x3f800000;
          auVar96 = vfnmadd213ps_fma(auVar95,local_1888,auVar87);
          auVar95 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
          auVar73._8_4_ = 0x219392ef;
          auVar73._0_8_ = 0x219392ef219392ef;
          auVar73._12_4_ = 0x219392ef;
          auVar88 = vcmpps_avx(auVar88,auVar73,5);
          auVar88 = vandps_avx(auVar88,auVar95);
          auVar74._0_4_ = auVar88._0_4_ * (float)local_1868._0_4_;
          auVar74._4_4_ = auVar88._4_4_ * (float)local_1868._4_4_;
          auVar74._8_4_ = auVar88._8_4_ * fStack_1860;
          auVar74._12_4_ = auVar88._12_4_ * fStack_185c;
          local_1738 = vminps_avx(auVar74,auVar87);
          auVar63._0_4_ = auVar88._0_4_ * (float)local_1878._0_4_;
          auVar63._4_4_ = auVar88._4_4_ * (float)local_1878._4_4_;
          auVar63._8_4_ = auVar88._8_4_ * fStack_1870;
          auVar63._12_4_ = auVar88._12_4_ * fStack_186c;
          local_1728 = vminps_avx(auVar63,auVar87);
          local_1718._4_4_ = uVar28;
          local_1718._0_4_ = uVar28;
          local_1718._8_4_ = uVar28;
          local_1718._12_4_ = uVar28;
          local_1768 = local_18a8._0_8_;
          uStack_1760 = local_18a8._8_8_;
          local_1758 = local_18b8._0_8_;
          uStack_1750 = local_18b8._8_8_;
          local_1748 = local_18c8;
          local_1708 = uVar4;
          uStack_1704 = uVar4;
          uStack_1700 = uVar4;
          uStack_16fc = uVar4;
          vpcmpeqd_avx2(ZEXT1632(local_1728),ZEXT1632(local_1728));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar88 = *(undefined1 (*) [16])(ray + 0x80);
          auVar95 = vblendvps_avx(auVar88,local_1898,auVar62);
          *(undefined1 (*) [16])(ray + 0x80) = auVar95;
          args.valid = (int *)local_1a28;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_1a28 = auVar62;
          args.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&args);
            auVar125 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar122 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1a28 == (undefined1  [16])0x0) {
            auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar61 = vpcmpeqd_avx(auVar61,auVar61);
            auVar131 = ZEXT1664(auVar61);
            auVar61 = auVar61 ^ auVar62;
          }
          else {
            p_Var7 = context->args->filter;
            auVar61 = vpcmpeqd_avx(auVar61,auVar61);
            auVar131 = ZEXT1664(auVar61);
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&args);
              auVar61 = vpcmpeqd_avx(auVar61,auVar61);
              auVar131 = ZEXT1664(auVar61);
              auVar125 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar122 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar62 = vpcmpeqd_avx(local_1a28,_DAT_01f7aa10);
            auVar61 = auVar131._0_16_ ^ auVar62;
            auVar75._8_4_ = 0xff800000;
            auVar75._0_8_ = 0xff800000ff800000;
            auVar75._12_4_ = 0xff800000;
            auVar62 = vblendvps_avx(auVar75,*(undefined1 (*) [16])(args.ray + 0x80),auVar62);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar62;
          }
          auVar61 = vpslld_avx(auVar61,0x1f);
          auVar62 = vpsrad_avx(auVar61,0x1f);
          auVar61 = vblendvps_avx(auVar88,*(undefined1 (*) [16])pRVar1,auVar61);
          *(undefined1 (*) [16])pRVar1 = auVar61;
        }
        auVar53 = vpandn_avx(auVar62,auVar53);
      }
      if (((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf])
         || (bVar40 = 2 < uVar37, uVar37 = uVar37 + 1, bVar40)) break;
    }
    auVar61 = vandps_avx(auVar53,auVar54);
    auVar54 = auVar54 & auVar53;
    if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar54[0xf])
    break;
  }
  terminated.field_0.i[0] = auVar131._0_4_ ^ auVar61._0_4_;
  terminated.field_0.i[1] = auVar131._4_4_ ^ auVar61._4_4_;
  terminated.field_0.i[2] = auVar131._8_4_ ^ auVar61._8_4_;
  terminated.field_0.i[3] = auVar131._12_4_ ^ auVar61._12_4_;
LAB_019c1a71:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])vVar25.field_0,(undefined1  [16])terminated.field_0);
  auVar53 = auVar131._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf])
  goto LAB_019c1b7f;
  auVar76._8_4_ = 0xff800000;
  auVar76._0_8_ = 0xff800000ff800000;
  auVar76._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar76,
                     (undefined1  [16])terminated.field_0);
  goto LAB_019c100c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }